

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  bool bVar1;
  int iVar2;
  secp256k1_modinv64_modinfo *psVar3;
  int64_t iVar4;
  int64_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  secp256k1_modinv64_signed62 *psVar11;
  secp256k1_modinv64_signed62 *psVar12;
  long lVar13;
  uint uVar14;
  ulong *extraout_RDX;
  long lVar15;
  long lVar16;
  secp256k1_modinv64_signed62 *a;
  long *extraout_RDX_00;
  long lVar17;
  long lVar18;
  secp256k1_modinv64_signed62 *b;
  int iVar19;
  int64_t *piVar20;
  secp256k1_modinv64_signed62 *psVar21;
  secp256k1_modinv64_signed62 *psVar22;
  long lVar23;
  int64_t *unaff_RBP;
  int64_t *a_00;
  int64_t *a_01;
  int64_t *piVar24;
  secp256k1_modinv64_modinfo *psVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  int64_t *piVar30;
  long lVar31;
  int64_t *piVar32;
  int64_t *piVar33;
  long lVar34;
  long lVar35;
  secp256k1_modinv64_modinfo *psVar36;
  secp256k1_modinv64_modinfo *modinfo_00;
  long lVar37;
  int64_t *piVar38;
  long lVar39;
  int64_t *piVar40;
  bool bVar41;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 e;
  secp256k1_modinv64_signed62 sStack_250;
  secp256k1_modinv64_signed62 sStack_228;
  secp256k1_modinv64_signed62 *psStack_200;
  int64_t *piStack_1f8;
  int64_t *piStack_1f0;
  ulong uStack_1e8;
  int64_t *piStack_1e0;
  ulong uStack_1d8;
  int64_t *piStack_1d0;
  secp256k1_modinv64_signed62 *psStack_1c8;
  long lStack_1c0;
  int64_t *piStack_1b8;
  int64_t *piStack_1b0;
  secp256k1_modinv64_signed62 *psStack_1a8;
  long lStack_1a0;
  secp256k1_modinv64_signed62 *psStack_198;
  secp256k1_modinv64_signed62 *psStack_190;
  secp256k1_modinv64_signed62 *psStack_188;
  secp256k1_modinv64_signed62 *psStack_180;
  long lStack_178;
  int64_t *piStack_170;
  int64_t *piStack_168;
  int64_t *piStack_160;
  secp256k1_modinv64_modinfo *psStack_158;
  int64_t *piStack_150;
  int64_t *piStack_148;
  long lStack_140;
  int64_t *piStack_138;
  code *pcStack_130;
  uint local_124;
  int64_t *local_120;
  secp256k1_modinv64_modinfo *local_118;
  int64_t *local_110 [2];
  ulong auStack_100 [5];
  secp256k1_modinv64_signed62 local_d8;
  secp256k1_modinv64_trans2x2 local_a8;
  secp256k1_modinv64_signed62 local_88;
  secp256k1_modinv64_signed62 local_58;
  
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  piVar40 = (int64_t *)0x0;
  local_88.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[4] = 0;
  local_58.v[2] = 0;
  local_58.v[3] = 0;
  local_58.v[0] = 1;
  local_d8.v[4] = (modinfo->modulus).v[4];
  local_d8.v[0] = (modinfo->modulus).v[0];
  local_d8.v[1] = (modinfo->modulus).v[1];
  local_d8.v[2] = (modinfo->modulus).v[2];
  local_d8.v[3] = (modinfo->modulus).v[3];
  auStack_100[3] = x->v[4];
  local_110[1] = (int64_t *)x->v[0];
  auStack_100[0] = x->v[1];
  auStack_100[1] = x->v[2];
  auStack_100[2] = x->v[3];
  lVar39 = -1;
  piVar20 = (int64_t *)0x5;
  local_120 = x->v;
  local_118 = modinfo;
  do {
    piVar24 = (int64_t *)local_d8.v[0];
    modinfo_00 = local_118;
    local_124 = (uint)piVar20;
    psVar3 = (secp256k1_modinv64_modinfo *)0x0;
    piVar30 = (int64_t *)0x0;
    psVar25 = (secp256k1_modinv64_modinfo *)0x1;
    uVar14 = 0x3e;
    a_00 = (int64_t *)0x1;
    piVar33 = local_110[1];
    piVar38 = (int64_t *)local_d8.v[0];
    while( true ) {
      a_01 = (int64_t *)(-1L << ((byte)uVar14 & 0x3f) | (ulong)piVar33);
      psVar11 = (secp256k1_modinv64_signed62 *)0x0;
      if (a_01 != (int64_t *)0x0) {
        for (; ((ulong)a_01 >> (long)psVar11 & 1) == 0;
            psVar11 = (secp256k1_modinv64_signed62 *)((long)psVar11->v + 1)) {
        }
      }
      bVar9 = (byte)psVar11;
      piVar32 = (int64_t *)((ulong)piVar33 >> (bVar9 & 0x3f));
      a_00 = (int64_t *)((long)a_00 << (bVar9 & 0x3f));
      psVar3 = (secp256k1_modinv64_modinfo *)((long)psVar3 << (bVar9 & 0x3f));
      lVar39 = lVar39 - (long)psVar11;
      uVar14 = uVar14 - (int)psVar11;
      local_110[0] = piVar40;
      if (uVar14 == 0) break;
      if (((ulong)piVar38 & 1) == 0) {
        pcStack_130 = (code *)0x142e13;
        secp256k1_modinv64_var_cold_8();
LAB_00142e13:
        pcStack_130 = (code *)0x142e18;
        secp256k1_modinv64_var_cold_7();
LAB_00142e18:
        pcStack_130 = (code *)0x142e1d;
        secp256k1_modinv64_var_cold_1();
LAB_00142e1d:
        pcStack_130 = (code *)0x142e22;
        secp256k1_modinv64_var_cold_2();
LAB_00142e22:
        pcStack_130 = (code *)0x142e27;
        secp256k1_modinv64_var_cold_6();
        piVar32 = piVar38;
        goto LAB_00142e27;
      }
      if (((ulong)piVar32 & 1) == 0) goto LAB_00142e13;
      a_01 = (int64_t *)((long)psVar3 * (long)local_110[1] + (long)a_00 * local_d8.v[0]);
      psVar11 = (secp256k1_modinv64_signed62 *)(ulong)(0x3e - uVar14);
      bVar9 = (byte)(0x3e - uVar14);
      piVar20 = (int64_t *)((long)piVar38 << (bVar9 & 0x3f));
      if (a_01 != piVar20) goto LAB_00142e18;
      piVar20 = (int64_t *)((long)psVar25 * (long)local_110[1] + (long)piVar30 * local_d8.v[0]);
      a_01 = (int64_t *)((long)piVar32 << (bVar9 & 0x3f));
      if (piVar20 != a_01) goto LAB_00142e1d;
      psVar11 = (secp256k1_modinv64_signed62 *)(lVar39 - 0x2ea);
      if (psVar11 < (secp256k1_modinv64_signed62 *)0xfffffffffffffa2d) goto LAB_00142e22;
      iVar2 = (int)piVar32;
      if (lVar39 < 0) {
        lVar39 = -lVar39;
        uVar10 = (int)lVar39 + 1;
        if ((int)uVar14 <= (int)uVar10) {
          uVar10 = uVar14;
        }
        psVar11 = (secp256k1_modinv64_signed62 *)(ulong)uVar10;
        a_01 = (int64_t *)(ulong)(uVar10 - 0x3f);
        if (0xffffffc1 < uVar10 - 0x3f) {
          psVar36 = (secp256k1_modinv64_modinfo *)-(long)psVar3;
          unaff_RBP = (int64_t *)-(long)a_00;
          piVar33 = (int64_t *)-(long)piVar38;
          piVar20 = (int64_t *)
                    ((ulong)(0x3fL << (-(char)uVar10 & 0x3fU)) >> (-(char)uVar10 & 0x3fU));
          uVar10 = (iVar2 * iVar2 + 0x3e) * iVar2 * (int)piVar33 & (uint)piVar20;
          psVar3 = psVar25;
          a_00 = piVar30;
          modinfo = psVar36;
          goto LAB_00142aed;
        }
        goto LAB_00142e31;
      }
      uVar10 = (int)lVar39 + 1;
      if ((int)uVar14 <= (int)uVar10) {
        uVar10 = uVar14;
      }
      psVar11 = (secp256k1_modinv64_signed62 *)(ulong)uVar10;
      a_01 = (int64_t *)(ulong)(uVar10 - 0x3f);
      if (uVar10 - 0x3f < 0xffffffc2) goto LAB_00142e2c;
      piVar20 = (int64_t *)((ulong)(0xfL << (-(char)uVar10 & 0x3fU)) >> (-(char)uVar10 & 0x3fU));
      uVar10 = -(iVar2 * (((int)piVar38 * 2 + 2U & 8) + (int)piVar38)) & (uint)piVar20;
      unaff_RBP = piVar30;
      psVar36 = psVar25;
      piVar33 = piVar32;
      piVar32 = piVar38;
LAB_00142aed:
      uVar6 = (ulong)uVar10;
      a_01 = (int64_t *)(uVar6 * (long)piVar32);
      piVar33 = (int64_t *)((long)piVar33 + (long)a_01);
      piVar30 = (int64_t *)((long)a_00 * uVar6 + (long)unaff_RBP);
      psVar11 = (secp256k1_modinv64_signed62 *)(uVar6 * (long)psVar3);
      psVar25 = (secp256k1_modinv64_modinfo *)((long)psVar11->v + (long)&psVar36->modulus);
      piVar38 = piVar32;
      if (((ulong)piVar33 & (ulong)piVar20) != 0) {
LAB_00142e27:
        pcStack_130 = (code *)0x142e2c;
        secp256k1_modinv64_var_cold_4();
        piVar38 = piVar32;
LAB_00142e2c:
        pcStack_130 = (code *)0x142e31;
        secp256k1_modinv64_var_cold_3();
LAB_00142e31:
        pcStack_130 = (code *)0x142e36;
        secp256k1_modinv64_var_cold_5();
        goto LAB_00142e36;
      }
    }
    a_01 = (int64_t *)((long)psVar3 * (long)piVar30);
    psVar11 = SUB168(SEXT816((long)psVar3) * SEXT816((long)piVar30),8);
    local_a8.u = (int64_t)a_00;
    local_a8.v = (int64_t)psVar3;
    local_a8.q = (int64_t)piVar30;
    local_a8.r = (int64_t)psVar25;
    if ((long)a_00 * (long)psVar25 - (long)a_01 != 0x4000000000000000 ||
        SUB168(SEXT816((long)a_00) * SEXT816((long)psVar25),8) - (long)psVar11 !=
        (ulong)((secp256k1_modinv64_signed62 *)((long)a_00 * (long)psVar25) < a_01)) {
LAB_00142e36:
      pcStack_130 = (code *)0x142e3b;
      secp256k1_modinv64_var_cold_9();
      modinfo_00 = modinfo;
LAB_00142e3b:
      pcStack_130 = (code *)0x142e40;
      secp256k1_modinv64_var_cold_20();
LAB_00142e40:
      pcStack_130 = (code *)0x142e45;
      secp256k1_modinv64_var_cold_19();
LAB_00142e45:
      pcStack_130 = (code *)0x142e4a;
      secp256k1_modinv64_var_cold_18();
      piVar40 = piVar24;
LAB_00142e4a:
      pcStack_130 = (code *)0x142e4f;
      secp256k1_modinv64_var_cold_17();
LAB_00142e4f:
      pcStack_130 = (code *)0x142e54;
      secp256k1_modinv64_var_cold_14();
LAB_00142e54:
      pcStack_130 = (code *)0x142e59;
      secp256k1_modinv64_var_cold_13();
LAB_00142e59:
      pcStack_130 = (code *)0x142e5e;
      secp256k1_modinv64_var_cold_12();
LAB_00142e5e:
      pcStack_130 = (code *)0x142e63;
      secp256k1_modinv64_var_cold_11();
LAB_00142e63:
      pcStack_130 = (code *)0x142e68;
      secp256k1_modinv64_var_cold_10();
      goto LAB_00142e68;
    }
    pcStack_130 = (code *)0x142b7b;
    secp256k1_modinv64_update_de_62(&local_88,&local_58,&local_a8,local_118);
    uVar14 = local_124;
    piVar38 = local_d8.v;
    piVar20 = (int64_t *)(ulong)local_124;
    a_00 = (int64_t *)(ulong)local_124;
    psVar11 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_130 = (code *)0x142b98;
    a_01 = piVar38;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar38,local_124,&modinfo_00->modulus,-1);
    if (iVar2 < 1) goto LAB_00142e3b;
    psVar11 = (secp256k1_modinv64_signed62 *)0x1;
    a_00 = (int64_t *)(ulong)uVar14;
    pcStack_130 = (code *)0x142bb2;
    a_01 = piVar38;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar38,uVar14,&modinfo_00->modulus,1);
    if (0 < iVar2) goto LAB_00142e40;
    piVar24 = (int64_t *)(local_110 + 1);
    a_00 = (int64_t *)(ulong)uVar14;
    psVar11 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_130 = (code *)0x142bd3;
    a_01 = piVar24;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar24,uVar14,&modinfo_00->modulus,-1);
    if (iVar2 < 1) goto LAB_00142e45;
    psVar11 = (secp256k1_modinv64_signed62 *)0x1;
    a_00 = (int64_t *)(ulong)uVar14;
    pcStack_130 = (code *)0x142bed;
    a_01 = piVar24;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar24,uVar14,&modinfo_00->modulus,1);
    piVar40 = piVar24;
    if (-1 < iVar2) goto LAB_00142e4a;
    pcStack_130 = (code *)0x142c0a;
    secp256k1_modinv64_update_fg_62_var
              (uVar14,(secp256k1_modinv64_signed62 *)piVar38,(secp256k1_modinv64_signed62 *)piVar24,
               &local_a8);
    piVar40 = local_110[0];
    if (local_110[1] != (int64_t *)0x0) {
LAB_00142c1b:
      lVar13 = (long)(int)uVar14;
      uVar6 = auStack_100[lVar13 + 4];
      psVar11 = (secp256k1_modinv64_signed62 *)local_110[lVar13];
      a_01 = (int64_t *)((long)uVar6 >> 0x3f ^ uVar6 | lVar13 + -2 >> 0x3f);
      a_00 = (int64_t *)((long)psVar11 >> 0x3f ^ (ulong)psVar11 | (ulong)a_01);
      if (a_00 == (int64_t *)0x0) {
        piVar20 = (int64_t *)(ulong)(uVar14 - 1);
        auStack_100[lVar13 + 3] = auStack_100[lVar13 + 3] | uVar6 << 0x3e;
        psVar11 = (secp256k1_modinv64_signed62 *)((long)psVar11 << 0x3e);
        (&local_118)[lVar13] =
             (secp256k1_modinv64_modinfo *)((ulong)(&local_118)[lVar13] | (ulong)psVar11);
      }
      if (10 < (int)piVar40) goto LAB_00142e4f;
      psVar11 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
      pcStack_130 = (code *)0x142c7e;
      iVar19 = (int)piVar20;
      a_00 = piVar20;
      a_01 = piVar38;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)piVar38,iVar19,&modinfo_00->modulus,-1);
      if (iVar2 < 1) goto LAB_00142e54;
      psVar11 = (secp256k1_modinv64_signed62 *)0x1;
      pcStack_130 = (code *)0x142c98;
      a_00 = piVar20;
      a_01 = piVar38;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)piVar38,iVar19,&modinfo_00->modulus,1);
      if (0 < iVar2) goto LAB_00142e59;
      piVar38 = (int64_t *)(local_110 + 1);
      psVar11 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
      pcStack_130 = (code *)0x142cb9;
      a_00 = piVar20;
      a_01 = piVar38;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)piVar38,iVar19,&modinfo_00->modulus,-1);
      if (iVar2 < 1) goto LAB_00142e5e;
      psVar11 = (secp256k1_modinv64_signed62 *)0x1;
      pcStack_130 = (code *)0x142cd3;
      a_00 = piVar20;
      a_01 = piVar38;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)piVar38,iVar19,&modinfo_00->modulus,1);
      if (iVar2 < 0) {
        bVar41 = true;
        piVar40 = (int64_t *)(ulong)((int)piVar40 + 1);
        goto LAB_00142d08;
      }
      goto LAB_00142e63;
    }
    if (1 < (int)uVar14) {
      uVar6 = 1;
      uVar7 = 0;
      do {
        uVar7 = uVar7 | auStack_100[uVar6 - 1];
        uVar6 = uVar6 + 1;
      } while (uVar14 != uVar6);
      if (uVar7 != 0) goto LAB_00142c1b;
    }
    bVar41 = false;
LAB_00142d08:
    modinfo = modinfo_00;
  } while (bVar41);
  a_01 = (int64_t *)(local_110 + 1);
  iVar19 = (int)piVar20;
  psVar11 = (secp256k1_modinv64_signed62 *)0x0;
  pcStack_130 = (code *)0x142d25;
  a_00 = piVar20;
  iVar2 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_01,iVar19,&SECP256K1_SIGNED62_ONE,0);
  if (iVar2 == 0) {
    pcStack_130 = (code *)0x142d47;
    iVar2 = secp256k1_modinv64_mul_cmp_62(&local_d8,iVar19,&SECP256K1_SIGNED62_ONE,-1);
    piVar40 = local_120;
    if (iVar2 == 0) {
LAB_00142dc9:
      pcStack_130 = (code *)0x142de4;
      secp256k1_modinv64_normalize_62(&local_88,auStack_100[(long)iVar19 + 4],modinfo_00);
      piVar40[4] = local_88.v[4];
      piVar40[2] = local_88.v[2];
      piVar40[3] = local_88.v[3];
      *piVar40 = local_88.v[0];
      piVar40[1] = local_88.v[1];
      return;
    }
    pcStack_130 = (code *)0x142d68;
    iVar2 = secp256k1_modinv64_mul_cmp_62(&local_d8,iVar19,&SECP256K1_SIGNED62_ONE,1);
    if (iVar2 == 0) goto LAB_00142dc9;
    a_00 = (int64_t *)0x5;
    psVar11 = (secp256k1_modinv64_signed62 *)0x0;
    pcStack_130 = (code *)0x142d82;
    a_01 = piVar40;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar40,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar2 == 0) {
      a_01 = local_88.v;
      a_00 = (int64_t *)0x5;
      psVar11 = (secp256k1_modinv64_signed62 *)0x0;
      pcStack_130 = (code *)0x142da5;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar2 == 0) {
        a_01 = local_d8.v;
        psVar11 = (secp256k1_modinv64_signed62 *)0x1;
        pcStack_130 = (code *)0x142dc1;
        a_00 = piVar20;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_01,iVar19,&modinfo_00->modulus,1);
        if (iVar2 == 0) goto LAB_00142dc9;
      }
    }
  }
  else {
LAB_00142e68:
    pcStack_130 = (code *)0x142e6d;
    secp256k1_modinv64_var_cold_15();
  }
  pcStack_130 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_16();
  uVar6 = *a_00;
  if (uVar6 >> 0x3e == 0) {
    uVar7 = a_00[1];
    if (0x3fffffffffffffff < uVar7) goto LAB_00142efc;
    psVar11 = (secp256k1_modinv64_signed62 *)a_00[2];
    if ((secp256k1_modinv64_signed62 *)0x3fffffffffffffff < psVar11) goto LAB_00142f01;
    uVar8 = a_00[3];
    if (0x3fffffffffffffff < uVar8) goto LAB_00142f06;
    a_00 = (int64_t *)a_00[4];
    if (a_00 < (secp256k1_modinv64_signed62 *)&DAT_00000100) {
      *a_01 = uVar7 << 0x3e | uVar6;
      a_01[1] = (long)psVar11 << 0x3c | uVar7 >> 2;
      a_01[2] = uVar8 << 0x3a | (ulong)psVar11 >> 4;
      a_01[3] = (long)a_00 << 0x38 | uVar8 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_01);
      return;
    }
  }
  else {
    piStack_138 = (int64_t *)0x142efc;
    secp256k1_scalar_from_signed62_cold_5();
LAB_00142efc:
    piStack_138 = (int64_t *)0x142f01;
    secp256k1_scalar_from_signed62_cold_4();
LAB_00142f01:
    piStack_138 = (int64_t *)0x142f06;
    secp256k1_scalar_from_signed62_cold_3();
LAB_00142f06:
    piStack_138 = (int64_t *)0x142f0b;
    secp256k1_scalar_from_signed62_cold_2();
  }
  piStack_138 = (int64_t *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  piStack_138 = unaff_RBP;
  lStack_140 = lVar39;
  piStack_148 = piVar40;
  piStack_150 = piVar38;
  psStack_158 = modinfo_00;
  piStack_160 = piVar20;
  lVar39 = *a_01;
  piStack_170 = (int64_t *)a_01[1];
  psStack_180 = (secp256k1_modinv64_signed62 *)a_01[2];
  lStack_1a0 = a_01[3];
  psStack_190 = (secp256k1_modinv64_signed62 *)a_01[4];
  piVar40 = (int64_t *)*a_00;
  piStack_168 = (int64_t *)a_00[1];
  lStack_178 = a_00[2];
  uStack_1d8 = *extraout_RDX;
  piStack_1d0 = (int64_t *)extraout_RDX[1];
  uStack_1e8 = extraout_RDX[2];
  piStack_1e0 = (int64_t *)extraout_RDX[3];
  psVar21 = (secp256k1_modinv64_signed62 *)a_00[3];
  psStack_198 = (secp256k1_modinv64_signed62 *)a_00[4];
  piVar20 = (int64_t *)0x5;
  psVar12 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  piStack_1f0 = (int64_t *)0x142fac;
  piVar24 = a_01;
  iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar11,-2);
  if (iVar2 < 1) {
    piStack_1f0 = (int64_t *)0x143acc;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_00143acc:
    piStack_1f0 = (int64_t *)0x143ad1;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_00143ad1:
    piStack_1f0 = (int64_t *)0x143ad6;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_00143ad6:
    piStack_1f0 = (int64_t *)0x143adb;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_00143adb:
    piStack_1f0 = (int64_t *)0x143ae0;
    secp256k1_modinv64_update_de_62_cold_30();
LAB_00143ae0:
    piStack_1f0 = (int64_t *)0x143ae5;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_00143ae5:
    piStack_1f0 = (int64_t *)0x143aea;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_00143aea:
    piStack_1f0 = (int64_t *)0x143aef;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar21 = psVar11;
LAB_00143aef:
    piStack_1f0 = (int64_t *)0x143af4;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_00143af4:
    piStack_1f0 = (int64_t *)0x143af9;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_00143af9:
    piStack_1f0 = (int64_t *)0x143afe;
    secp256k1_modinv64_update_de_62_cold_5();
    psVar22 = psVar21;
LAB_00143afe:
    piStack_1f0 = (int64_t *)0x143b03;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_00143b03:
    piStack_1f0 = (int64_t *)0x143b08;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_00143b08:
    piStack_1f0 = (int64_t *)0x143b0d;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_00143b0d:
    piStack_1f0 = (int64_t *)0x143b12;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00143b12:
    piStack_1f0 = (int64_t *)0x143b17;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00143b17:
    piStack_1f0 = (int64_t *)0x143b1c;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_00143b1c:
    piStack_1f0 = (int64_t *)0x143b21;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_00143b21:
    piStack_1f0 = (int64_t *)0x143b26;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_00143b26:
    piStack_1f0 = (int64_t *)0x143b2b;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_00143b2b:
    piStack_1f0 = (int64_t *)0x143b30;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_00143b30:
    piVar38 = piVar40;
    a_00 = a_01;
    piStack_1f0 = (int64_t *)0x143b35;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_00143b35:
    piStack_1f0 = (int64_t *)0x143b3a;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_00143b3a:
    piStack_1f0 = (int64_t *)0x143b3f;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_00143b3f:
    piStack_1f0 = (int64_t *)0x143b44;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_00143b44:
    piStack_1f0 = (int64_t *)0x143b49;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_00143b49:
    piStack_1f0 = (int64_t *)0x143b4e;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_00143b4e:
    piStack_1f0 = (int64_t *)0x143b53;
    secp256k1_modinv64_update_de_62_cold_23();
    a_01 = a_00;
    piVar33 = piVar38;
LAB_00143b53:
    piStack_1f0 = (int64_t *)0x143b58;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_00143b58:
    piStack_1f0 = (int64_t *)0x143b5d;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_00143b5d:
    piStack_1f0 = (int64_t *)0x143b62;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_00143b62:
    psVar21 = psVar12;
    piStack_1f0 = (int64_t *)0x143b67;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_00143b67:
    uVar14 = (uint)piVar20;
    piStack_1f0 = (int64_t *)0x143b6c;
    secp256k1_modinv64_update_de_62_cold_17();
  }
  else {
    psVar12 = (secp256k1_modinv64_signed62 *)0x1;
    piVar20 = (int64_t *)0x5;
    piStack_1f0 = (int64_t *)0x142fc9;
    piVar24 = a_01;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar11,1);
    if (-1 < iVar2) goto LAB_00143acc;
    piVar20 = (int64_t *)0x5;
    psVar12 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    piStack_1f0 = (int64_t *)0x142fe8;
    piVar24 = a_00;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,psVar11,-2);
    if (iVar2 < 1) goto LAB_00143ad1;
    psVar12 = (secp256k1_modinv64_signed62 *)0x1;
    piVar20 = (int64_t *)0x5;
    piStack_1f0 = (int64_t *)0x143005;
    piVar24 = a_00;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,psVar11,1);
    if (-1 < iVar2) goto LAB_00143ad6;
    piStack_1f0 = (int64_t *)0x14302b;
    piStack_1b0 = a_01;
    psStack_188 = psVar21;
    iVar4 = secp256k1_modinv64_abs(uStack_1d8);
    piStack_1f0 = (int64_t *)0x143038;
    piVar24 = piStack_1d0;
    iVar5 = secp256k1_modinv64_abs((int64_t)piStack_1d0);
    psVar12 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar5);
    a_01 = (int64_t *)0x3fffffffffffffff;
    if ((long)psVar12 < iVar4) goto LAB_00143adb;
    piStack_1f0 = (int64_t *)0x143053;
    iVar4 = secp256k1_modinv64_abs(uStack_1e8);
    piStack_1f0 = (int64_t *)0x143060;
    piVar24 = piStack_1e0;
    iVar5 = secp256k1_modinv64_abs((int64_t)piStack_1e0);
    piVar38 = piStack_1b0;
    psVar12 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar5);
    if ((long)psVar12 < iVar4) goto LAB_00143ae0;
    a_01 = (int64_t *)0x7fffffffffffffff;
    piVar20 = (int64_t *)(uStack_1d8 * lVar39);
    psVar12 = SUB168(SEXT816((long)uStack_1d8) * SEXT816(lVar39),8);
    uVar6 = (long)piStack_1d0 * (long)piVar40;
    lVar15 = SUB168(SEXT816((long)piStack_1d0) * SEXT816((long)piVar40),8);
    lVar13 = (0x7fffffffffffffff - lVar15) - (long)psVar12;
    if (-1 < lVar15 &&
        (SBORROW8(0x7fffffffffffffff - lVar15,(long)psVar12) !=
        SBORROW8(lVar13,(ulong)((undefined1 *)~uVar6 < piVar20))) !=
        (long)(lVar13 - (ulong)((undefined1 *)~uVar6 < piVar20)) < 0) goto LAB_00143ae5;
    piVar33 = (int64_t *)(uVar6 + (long)piVar20);
    lVar31 = (long)psVar12->v + (ulong)CARRY8(uVar6,(ulong)piVar20) + lVar15;
    uVar7 = uStack_1e8 * lVar39;
    lVar15 = SUB168(SEXT816((long)uStack_1e8) * SEXT816(lVar39),8);
    uVar8 = (long)piStack_1e0 * (long)piVar40;
    lVar16 = SUB168(SEXT816((long)piStack_1e0) * SEXT816((long)piVar40),8);
    uVar6 = (ulong)(-uVar8 - 1 < uVar7);
    lVar39 = (0x7fffffffffffffff - lVar16) - lVar15;
    lVar13 = lVar39 - uVar6;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar15) != SBORROW8(lVar39,uVar6)) == lVar13 < 0;
    psVar12 = (secp256k1_modinv64_signed62 *)
              CONCAT71((int7)((ulong)lVar13 >> 8),lVar16 < 0 || bVar41);
    if (lVar16 >= 0 && !bVar41) goto LAB_00143aea;
    psVar21 = (secp256k1_modinv64_signed62 *)((long)psStack_198 >> 0x3f);
    lStack_1c0 = ((ulong)piStack_1d0 & (ulong)psVar21) + (uStack_1d8 & (long)psStack_190 >> 0x3f);
    uVar26 = uVar8 + uVar7;
    piVar24 = (int64_t *)(lVar16 + lVar15 + (ulong)CARRY8(uVar8,uVar7));
    lVar39 = psVar11->v[0];
    piVar20 = (int64_t *)psVar11[1].v[0];
    psVar12 = (secp256k1_modinv64_signed62 *)0x3fffffffffffffff;
    lStack_1c0 = lStack_1c0 - ((long)piVar20 * (long)piVar33 + lStack_1c0 & 0x3fffffffffffffffU);
    uVar7 = lStack_1c0 * lVar39;
    lVar15 = SUB168(SEXT816(lStack_1c0) * SEXT816(lVar39),8);
    uVar6 = (ulong)((undefined1 *)(-uVar7 - 1) < piVar33);
    lVar13 = (0x7fffffffffffffff - lVar15) - lVar31;
    piVar40 = (int64_t *)((-0x8000000000000000 - lVar15) - (ulong)(uVar7 != 0));
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar31) != SBORROW8(lVar13,uVar6)) ==
             (long)(lVar13 - uVar6) < 0;
    if (lVar15 < 0) {
      bVar41 = (SBORROW8(lVar31,(long)piVar40) !=
               SBORROW8(lVar31 - (long)piVar40,(ulong)(piVar33 < (undefined1 *)-uVar7))) ==
               (long)((lVar31 - (long)piVar40) - (ulong)(piVar33 < (undefined1 *)-uVar7)) < 0;
    }
    piStack_1b8 = a_00;
    psStack_1a8 = psVar11;
    if (!bVar41) goto LAB_00143aef;
    lVar13 = ((ulong)psVar21 & (ulong)piStack_1e0) + ((long)psStack_190 >> 0x3f & uStack_1e8);
    psVar21 = (secp256k1_modinv64_signed62 *)
              (lVar13 - ((long)piVar20 * uVar26 + lVar13 & 0x3fffffffffffffff));
    lVar15 = lVar15 + lVar31 + (ulong)CARRY8(uVar7,(ulong)piVar33);
    uVar8 = (long)psVar21 * lVar39;
    lVar13 = SUB168(SEXT816((long)psVar21) * SEXT816(lVar39),8);
    uVar6 = (ulong)(-uVar8 - 1 < uVar26);
    lVar39 = (0x7fffffffffffffff - lVar13) - (long)piVar24;
    piVar20 = (int64_t *)((-0x8000000000000000 - lVar13) - (ulong)(uVar8 != 0));
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar13,(long)piVar24) != SBORROW8(lVar39,uVar6)) ==
             (long)(lVar39 - uVar6) < 0;
    if (lVar13 < 0) {
      bVar41 = (SBORROW8((long)piVar24,(long)piVar20) !=
               SBORROW8((long)piVar24 - (long)piVar20,(ulong)(uVar26 < -uVar8))) ==
               (long)(((long)piVar24 - (long)piVar20) - (ulong)(uVar26 < -uVar8)) < 0;
    }
    if (!bVar41) goto LAB_00143af4;
    lVar39 = (long)piVar24 + (ulong)CARRY8(uVar8,uVar26) + lVar13;
    if ((uVar7 + (long)piVar33 & 0x3fffffffffffffff) != 0) goto LAB_00143af9;
    psVar22 = psVar21;
    if ((uVar8 + uVar26 & 0x3fffffffffffffff) != 0) goto LAB_00143afe;
    psVar22 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    uVar6 = (ulong)(uVar7 + (long)piVar33) >> 0x3e | lVar15 * 4;
    psVar12 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar29 = uStack_1d8 * (long)piStack_170 + uVar6;
    piVar24 = (int64_t *)
              (SUB168(SEXT816((long)uStack_1d8) * SEXT816((long)piStack_170),8) + (lVar15 >> 0x3e) +
              (ulong)CARRY8(uStack_1d8 * (long)piStack_170,uVar6));
    uVar7 = (long)piStack_1d0 * (long)piStack_168;
    lVar16 = SUB168(SEXT816((long)piStack_1d0) * SEXT816((long)piStack_168),8);
    uVar6 = (ulong)(-uVar7 - 1 < uVar29);
    lVar13 = (0x7fffffffffffffff - lVar16) - (long)piVar24;
    lVar31 = (-0x8000000000000000 - lVar16) - (ulong)(uVar7 != 0);
    lVar15 = (long)piVar24 - lVar31;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar16,(long)piVar24) != SBORROW8(lVar13,uVar6)) ==
             (long)(lVar13 - uVar6) < 0;
    if (lVar16 < 0) {
      bVar41 = (SBORROW8((long)piVar24,lVar31) != SBORROW8(lVar15,(ulong)(uVar29 < -uVar7))) ==
               (long)(lVar15 - (ulong)(uVar29 < -uVar7)) < 0;
    }
    piVar20 = (int64_t *)(ulong)bVar41;
    a_01 = piStack_170;
    piVar40 = piStack_168;
    psStack_1c8 = psVar21;
    if (bVar41 == false) goto LAB_00143b03;
    uVar6 = uVar8 + uVar26 >> 0x3e | lVar39 * 4;
    uVar8 = uVar29 + uVar7;
    piVar24 = (int64_t *)((long)piVar24 + (ulong)CARRY8(uVar29,uVar7) + lVar16);
    uVar26 = uStack_1e8 * (long)piStack_170 + uVar6;
    lVar16 = SUB168(SEXT816((long)uStack_1e8) * SEXT816((long)piStack_170),8) + (lVar39 >> 0x3e) +
             (ulong)CARRY8(uStack_1e8 * (long)piStack_170,uVar6);
    uVar7 = (long)piStack_1e0 * (long)piStack_168;
    lVar15 = SUB168(SEXT816((long)piStack_1e0) * SEXT816((long)piStack_168),8);
    uVar6 = (ulong)(-uVar7 - 1 < uVar26);
    lVar39 = (0x7fffffffffffffff - lVar15) - lVar16;
    lVar31 = (-0x8000000000000000 - lVar15) - (ulong)(uVar7 != 0);
    lVar13 = lVar16 - lVar31;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar16) != SBORROW8(lVar39,uVar6)) ==
             (long)(lVar39 - uVar6) < 0;
    if (lVar15 < 0) {
      bVar41 = (SBORROW8(lVar16,lVar31) != SBORROW8(lVar13,(ulong)(uVar26 < -uVar7))) ==
               (long)(lVar13 - (ulong)(uVar26 < -uVar7)) < 0;
    }
    piVar20 = (int64_t *)(ulong)bVar41;
    if (bVar41 == false) goto LAB_00143b08;
    a_01 = (int64_t *)0x7fffffffffffffff;
    uVar6 = uVar26 + uVar7;
    lVar13 = lVar16 + lVar15 + (ulong)CARRY8(uVar26,uVar7);
    lVar39 = psVar11->v[1];
    if (lVar39 != 0) {
      uVar26 = lVar39 * lStack_1c0;
      lVar16 = SUB168(SEXT816(lVar39) * SEXT816(lStack_1c0),8);
      uVar7 = (ulong)(-uVar26 - 1 < uVar8);
      lVar15 = (0x7fffffffffffffff - lVar16) - (long)piVar24;
      piVar20 = (int64_t *)((-0x8000000000000000 - lVar16) - (ulong)(uVar26 != 0));
      bVar41 = (SBORROW8(0x7fffffffffffffff - lVar16,(long)piVar24) != SBORROW8(lVar15,uVar7)) ==
               (long)(lVar15 - uVar7) < 0;
      if (lVar16 < 0) {
        bVar41 = (SBORROW8((long)piVar24,(long)piVar20) !=
                 SBORROW8((long)piVar24 - (long)piVar20,(ulong)(uVar8 < -uVar26))) ==
                 (long)(((long)piVar24 - (long)piVar20) - (ulong)(uVar8 < -uVar26)) < 0;
      }
      psVar12 = psVar21;
      piVar33 = piStack_168;
      if (!bVar41) goto LAB_00143b53;
      uVar29 = lVar39 * (long)psVar21;
      lVar31 = SUB168(SEXT816(lVar39) * SEXT816((long)psVar21),8);
      uVar7 = (ulong)(-uVar29 - 1 < uVar6);
      lVar39 = (0x7fffffffffffffff - lVar31) - lVar13;
      lVar37 = (-0x8000000000000000 - lVar31) - (ulong)(uVar29 != 0);
      lVar15 = lVar13 - lVar37;
      piVar33 = (int64_t *)(lVar15 - (ulong)(uVar6 < -uVar29));
      bVar41 = (SBORROW8(0x7fffffffffffffff - lVar31,lVar13) != SBORROW8(lVar39,uVar7)) ==
               (long)(lVar39 - uVar7) < 0;
      if (lVar31 < 0) {
        bVar41 = (SBORROW8(lVar13,lVar37) != SBORROW8(lVar15,(ulong)(uVar6 < -uVar29))) ==
                 (long)piVar33 < 0;
      }
      piVar20 = (int64_t *)(ulong)bVar41;
      if (bVar41 != false) {
        bVar41 = CARRY8(uVar8,uVar26);
        uVar8 = uVar8 + uVar26;
        piVar24 = (int64_t *)((long)piVar24 + (ulong)bVar41 + lVar16);
        bVar41 = CARRY8(uVar6,uVar29);
        uVar6 = uVar6 + uVar29;
        lVar13 = lVar13 + lVar31 + (ulong)bVar41;
        goto LAB_00143427;
      }
      goto LAB_00143b58;
    }
LAB_00143427:
    uVar7 = (long)piVar24 << 2 | uVar8 >> 0x3e;
    uVar29 = uStack_1d8 * (long)psStack_180 + uVar7;
    piVar24 = (int64_t *)
              (((long)piVar24 >> 0x3e) +
               SUB168(SEXT816((long)uStack_1d8) * SEXT816((long)psStack_180),8) +
              (ulong)CARRY8(uStack_1d8 * (long)psStack_180,uVar7));
    uVar26 = (long)piStack_1d0 * lStack_178;
    lVar16 = SUB168(SEXT816((long)piStack_1d0) * SEXT816(lStack_178),8);
    uVar7 = (ulong)(-uVar26 - 1 < uVar29);
    lVar39 = (0x7fffffffffffffff - lVar16) - (long)piVar24;
    lVar31 = (-0x8000000000000000 - lVar16) - (ulong)(uVar26 != 0);
    lVar15 = (long)piVar24 - lVar31;
    *piStack_1b0 = uVar8 & 0x3fffffffffffffff;
    *a_00 = uVar6 & 0x3fffffffffffffff;
    bVar41 = (SBORROW8((long)piVar24,lVar31) != SBORROW8(lVar15,(ulong)(uVar29 < -uVar26))) ==
             (long)(lVar15 - (ulong)(uVar29 < -uVar26)) < 0;
    piVar20 = (int64_t *)(ulong)bVar41;
    bVar1 = (SBORROW8(0x7fffffffffffffff - lVar16,(long)piVar24) != SBORROW8(lVar39,uVar7)) ==
            (long)(lVar39 - uVar7) < 0;
    if (lVar16 < 0) {
      bVar1 = bVar41;
    }
    psVar12 = psStack_180;
    piVar40 = piStack_1b0;
    if (!bVar1) goto LAB_00143b0d;
    uVar6 = uVar6 >> 0x3e | lVar13 << 2;
    uVar27 = uVar29 + uVar26;
    piVar24 = (int64_t *)((long)piVar24 + (ulong)CARRY8(uVar29,uVar26) + lVar16);
    uVar8 = uStack_1e8 * (long)psStack_180 + uVar6;
    lVar15 = SUB168(SEXT816((long)uStack_1e8) * SEXT816((long)psStack_180),8) + (lVar13 >> 0x3e) +
             (ulong)CARRY8(uStack_1e8 * (long)psStack_180,uVar6);
    uVar7 = (long)piStack_1e0 * lStack_178;
    lVar13 = SUB168(SEXT816((long)piStack_1e0) * SEXT816(lStack_178),8);
    uVar6 = (ulong)(-uVar7 - 1 < uVar8);
    lVar39 = (0x7fffffffffffffff - lVar13) - lVar15;
    psVar12 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    psVar22 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar13) - (ulong)(uVar7 != 0));
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar15) != SBORROW8(lVar39,uVar6)) ==
             (long)(lVar39 - uVar6) < 0;
    if (lVar13 < 0) {
      bVar41 = (SBORROW8(lVar15,(long)psVar22) !=
               SBORROW8(lVar15 - (long)psVar22,(ulong)(uVar8 < -uVar7))) ==
               (long)((lVar15 - (long)psVar22) - (ulong)(uVar8 < -uVar7)) < 0;
    }
    piVar20 = (int64_t *)(ulong)bVar41;
    if (bVar41 == false) goto LAB_00143b12;
    uVar6 = uVar8 + uVar7;
    lVar13 = lVar15 + lVar13 + (ulong)CARRY8(uVar8,uVar7);
    lVar39 = psVar11->v[2];
    if (lVar39 != 0) {
      uVar8 = lVar39 * lStack_1c0;
      lVar16 = SUB168(SEXT816(lVar39) * SEXT816(lStack_1c0),8);
      uVar7 = (ulong)(-uVar8 - 1 < uVar27);
      lVar15 = (0x7fffffffffffffff - lVar16) - (long)piVar24;
      piVar20 = (int64_t *)((-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0));
      bVar41 = (SBORROW8(0x7fffffffffffffff - lVar16,(long)piVar24) != SBORROW8(lVar15,uVar7)) ==
               (long)(lVar15 - uVar7) < 0;
      if (lVar16 < 0) {
        bVar41 = (SBORROW8((long)piVar24,(long)piVar20) !=
                 SBORROW8((long)piVar24 - (long)piVar20,(ulong)(uVar27 < -uVar8))) ==
                 (long)(((long)piVar24 - (long)piVar20) - (ulong)(uVar27 < -uVar8)) < 0;
      }
      piVar33 = piStack_1b0;
      if (!bVar41) goto LAB_00143b5d;
      uVar26 = lVar39 * (long)psVar21;
      lVar31 = SUB168(SEXT816(lVar39) * SEXT816((long)psVar21),8);
      uVar7 = (ulong)(-uVar26 - 1 < uVar6);
      lVar39 = (0x7fffffffffffffff - lVar31) - lVar13;
      lVar37 = (-0x8000000000000000 - lVar31) - (ulong)(uVar26 != 0);
      lVar15 = lVar13 - lVar37;
      piVar33 = (int64_t *)
                (ulong)((SBORROW8(lVar13,lVar37) != SBORROW8(lVar15,(ulong)(uVar6 < -uVar26))) ==
                       (long)(lVar15 - (ulong)(uVar6 < -uVar26)) < 0);
      piVar20 = (int64_t *)
                (ulong)((SBORROW8(0x7fffffffffffffff - lVar31,lVar13) != SBORROW8(lVar39,uVar7)) ==
                       (long)(lVar39 - uVar7) < 0);
      if (lVar31 < 0) {
        piVar20 = piVar33;
      }
      if ((char)piVar20 != '\0') {
        bVar41 = CARRY8(uVar27,uVar8);
        uVar27 = uVar27 + uVar8;
        piVar24 = (int64_t *)((long)piVar24 + (ulong)bVar41 + lVar16);
        bVar41 = CARRY8(uVar6,uVar26);
        uVar6 = uVar6 + uVar26;
        lVar13 = lVar13 + lVar31 + (ulong)bVar41;
        goto LAB_00143621;
      }
      goto LAB_00143b62;
    }
LAB_00143621:
    a_01 = (int64_t *)0x8000000000000000;
    psVar22 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar7 = (long)piVar24 << 2 | uVar27 >> 0x3e;
    uVar26 = uStack_1d8 * lStack_1a0 + uVar7;
    piVar24 = (int64_t *)
              (((long)piVar24 >> 0x3e) + SUB168(SEXT816((long)uStack_1d8) * SEXT816(lStack_1a0),8) +
              (ulong)CARRY8(uStack_1d8 * lStack_1a0,uVar7));
    uVar8 = (long)piStack_1d0 * (long)psStack_188;
    lVar16 = SUB168(SEXT816((long)piStack_1d0) * SEXT816((long)psStack_188),8);
    uVar7 = (ulong)(-uVar8 - 1 < uVar26);
    lVar39 = (0x7fffffffffffffff - lVar16) - (long)piVar24;
    lVar31 = (-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0);
    lVar15 = (long)piVar24 - lVar31;
    piStack_1b0[1] = uVar27 & 0x3fffffffffffffff;
    a_00[1] = uVar6 & 0x3fffffffffffffff;
    bVar41 = (SBORROW8((long)piVar24,lVar31) != SBORROW8(lVar15,(ulong)(uVar26 < -uVar8))) ==
             (long)(lVar15 - (ulong)(uVar26 < -uVar8)) < 0;
    piVar20 = (int64_t *)(ulong)bVar41;
    bVar1 = (SBORROW8(0x7fffffffffffffff - lVar16,(long)piVar24) != SBORROW8(lVar39,uVar7)) ==
            (long)(lVar39 - uVar7) < 0;
    if (lVar16 < 0) {
      bVar1 = bVar41;
    }
    psVar12 = psStack_188;
    if (!bVar1) goto LAB_00143b17;
    uVar6 = uVar6 >> 0x3e | lVar13 << 2;
    uVar29 = uVar26 + uVar8;
    piVar24 = (int64_t *)((long)piVar24 + (ulong)CARRY8(uVar26,uVar8) + lVar16);
    uVar8 = uStack_1e8 * lStack_1a0 + uVar6;
    lVar15 = SUB168(SEXT816((long)uStack_1e8) * SEXT816(lStack_1a0),8) + (lVar13 >> 0x3e) +
             (ulong)CARRY8(uStack_1e8 * lStack_1a0,uVar6);
    uVar7 = (long)piStack_1e0 * (long)psStack_188;
    lVar13 = SUB168(SEXT816((long)piStack_1e0) * SEXT816((long)psStack_188),8);
    uVar6 = (ulong)(-uVar7 - 1 < uVar8);
    lVar39 = (0x7fffffffffffffff - lVar13) - lVar15;
    psVar22 = (secp256k1_modinv64_signed62 *)(lVar39 - uVar6);
    psVar12 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    a_01 = (int64_t *)((-0x8000000000000000 - lVar13) - (ulong)(uVar7 != 0));
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar15) != SBORROW8(lVar39,uVar6)) ==
             (long)psVar22 < 0;
    if (lVar13 < 0) {
      bVar41 = (SBORROW8(lVar15,(long)a_01) != SBORROW8(lVar15 - (long)a_01,(ulong)(uVar8 < -uVar7))
               ) == (long)((lVar15 - (long)a_01) - (ulong)(uVar8 < -uVar7)) < 0;
    }
    piVar20 = (int64_t *)(ulong)bVar41;
    if (bVar41 == false) goto LAB_00143b1c;
    uVar6 = uVar8 + uVar7;
    lVar13 = lVar15 + lVar13 + (ulong)CARRY8(uVar8,uVar7);
    lVar39 = psVar11->v[3];
    if (lVar39 == 0) {
LAB_00143804:
      a_01 = (int64_t *)0x8000000000000000;
      uVar7 = (long)piVar24 << 2 | uVar29 >> 0x3e;
      uVar26 = uStack_1d8 * (long)psStack_190 + uVar7;
      piVar24 = (int64_t *)
                (((long)piVar24 >> 0x3e) +
                 SUB168(SEXT816((long)uStack_1d8) * SEXT816((long)psStack_190),8) +
                (ulong)CARRY8(uStack_1d8 * (long)psStack_190,uVar7));
      uVar8 = (long)piStack_1d0 * (long)psStack_198;
      lVar16 = SUB168(SEXT816((long)piStack_1d0) * SEXT816((long)psStack_198),8);
      uVar7 = (ulong)(-uVar8 - 1 < uVar26);
      lVar39 = (0x7fffffffffffffff - lVar16) - (long)piVar24;
      lVar31 = (-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0);
      lVar15 = (long)piVar24 - lVar31;
      piStack_1b0[2] = uVar29 & 0x3fffffffffffffff;
      a_00[2] = uVar6 & 0x3fffffffffffffff;
      bVar41 = (SBORROW8((long)piVar24,lVar31) != SBORROW8(lVar15,(ulong)(uVar26 < -uVar8))) ==
               (long)(lVar15 - (ulong)(uVar26 < -uVar8)) < 0;
      piVar20 = (int64_t *)(ulong)bVar41;
      bVar1 = (SBORROW8(0x7fffffffffffffff - lVar16,(long)piVar24) != SBORROW8(lVar39,uVar7)) ==
              (long)(lVar39 - uVar7) < 0;
      if (lVar16 < 0) {
        bVar1 = bVar41;
      }
      psVar12 = psStack_198;
      psVar22 = psStack_190;
      if (!bVar1) goto LAB_00143b21;
      uVar6 = uVar6 >> 0x3e | lVar13 << 2;
      uVar29 = uVar26 + uVar8;
      piVar24 = (int64_t *)((long)piVar24 + (ulong)CARRY8(uVar26,uVar8) + lVar16);
      uVar8 = uStack_1e8 * (long)psStack_190 + uVar6;
      lVar16 = SUB168(SEXT816((long)uStack_1e8) * SEXT816((long)psStack_190),8) + (lVar13 >> 0x3e) +
               (ulong)CARRY8(uStack_1e8 * (long)psStack_190,uVar6);
      uVar7 = (long)piStack_1e0 * (long)psStack_198;
      lVar15 = SUB168(SEXT816((long)piStack_1e0) * SEXT816((long)psStack_198),8);
      uVar6 = (ulong)(-uVar7 - 1 < uVar8);
      lVar39 = (0x7fffffffffffffff - lVar15) - lVar16;
      lVar31 = (-0x8000000000000000 - lVar15) - (ulong)(uVar7 != 0);
      lVar13 = lVar16 - lVar31;
      bVar41 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar16) != SBORROW8(lVar39,uVar6)) ==
               (long)(lVar39 - uVar6) < 0;
      if (lVar15 < 0) {
        bVar41 = (SBORROW8(lVar16,lVar31) != SBORROW8(lVar13,(ulong)(uVar8 < -uVar7))) ==
                 (long)(lVar13 - (ulong)(uVar8 < -uVar7)) < 0;
      }
      piVar20 = (int64_t *)(ulong)bVar41;
      if (bVar41 == false) goto LAB_00143b26;
      uVar26 = uVar8 + uVar7;
      lVar15 = lVar16 + lVar15 + (ulong)CARRY8(uVar8,uVar7);
      lVar39 = psVar11->v[4];
      uVar7 = lVar39 * lStack_1c0;
      piVar20 = SUB168(SEXT816(lVar39) * SEXT816(lStack_1c0),8);
      uVar6 = (ulong)(-uVar7 - 1 < uVar29);
      lVar13 = (0x7fffffffffffffff - (long)piVar20) - (long)piVar24;
      piVar40 = (int64_t *)((-0x8000000000000000 - (long)piVar20) - (ulong)(uVar7 != 0));
      bVar41 = (SBORROW8(0x7fffffffffffffff - (long)piVar20,(long)piVar24) != SBORROW8(lVar13,uVar6)
               ) == (long)(lVar13 - uVar6) < 0;
      if ((long)piVar20 < 0) {
        bVar41 = (SBORROW8((long)piVar24,(long)piVar40) !=
                 SBORROW8((long)piVar24 - (long)piVar40,(ulong)(uVar29 < -uVar7))) ==
                 (long)(((long)piVar24 - (long)piVar40) - (ulong)(uVar29 < -uVar7)) < 0;
      }
      if (!bVar41) goto LAB_00143b2b;
      uVar8 = lVar39 * (long)psVar21;
      lVar13 = SUB168(SEXT816(lVar39) * SEXT816((long)psVar21),8);
      psVar22 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
      uVar6 = (ulong)(-uVar8 - 1 < uVar26);
      lVar39 = (0x7fffffffffffffff - lVar13) - lVar15;
      a_01 = (int64_t *)((-0x8000000000000000 - lVar13) - (ulong)(uVar8 != 0));
      bVar41 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar15) != SBORROW8(lVar39,uVar6)) ==
               (long)(lVar39 - uVar6) < 0;
      if (lVar13 < 0) {
        bVar41 = (SBORROW8(lVar15,(long)a_01) !=
                 SBORROW8(lVar15 - (long)a_01,(ulong)(uVar26 < -uVar8))) ==
                 (long)((lVar15 - (long)a_01) - (ulong)(uVar26 < -uVar8)) < 0;
      }
      psVar12 = (secp256k1_modinv64_signed62 *)(ulong)bVar41;
      if (bVar41 == false) goto LAB_00143b30;
      lVar16 = (long)piVar20 + (long)piVar24 + (ulong)CARRY8(uVar7,uVar29);
      lVar39 = lVar13 + lVar15 + (ulong)CARRY8(uVar8,uVar26);
      psVar12 = (secp256k1_modinv64_signed62 *)(lVar16 * 4 | uVar7 + uVar29 >> 0x3e);
      piStack_1b0[3] = uVar7 + uVar29 & 0x3fffffffffffffff;
      a_00[3] = uVar8 + uVar26 & 0x3fffffffffffffff;
      piVar24 = psVar12[0x333333333333332].v + 4;
      piVar20 = (int64_t *)
                ((lVar16 >> 0x3e) + -1 +
                (ulong)((secp256k1_modinv64_signed62 *)0x7fffffffffffffff < psVar12));
      if (piVar20 != (int64_t *)0xffffffffffffffff) goto LAB_00143b35;
      piVar20 = (int64_t *)0xffffffffffffffff;
      uVar6 = uVar8 + uVar26 >> 0x3e | lVar39 * 4;
      piStack_1b0[4] = (int64_t)psVar12;
      psVar22 = (secp256k1_modinv64_signed62 *)(uVar6 + 0x8000000000000000);
      if ((lVar39 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar6) != -1) goto LAB_00143b3a;
      a_00[4] = uVar6;
      piVar20 = (int64_t *)0x5;
      psVar12 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
      piStack_1f0 = (int64_t *)0x143a54;
      piVar24 = piStack_1b0;
      iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)piStack_1b0,5,psVar11,-2)
      ;
      if (iVar2 < 1) goto LAB_00143b3f;
      psVar12 = (secp256k1_modinv64_signed62 *)0x1;
      piVar20 = (int64_t *)0x5;
      piStack_1f0 = (int64_t *)0x143a71;
      piVar24 = piVar38;
      iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)piVar38,5,psVar11,1);
      if (-1 < iVar2) goto LAB_00143b44;
      piVar20 = (int64_t *)0x5;
      psVar12 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
      piStack_1f0 = (int64_t *)0x143a90;
      piVar24 = a_00;
      iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,psVar11,-2);
      if (iVar2 < 1) goto LAB_00143b49;
      psVar12 = (secp256k1_modinv64_signed62 *)0x1;
      piVar20 = (int64_t *)0x5;
      piStack_1f0 = (int64_t *)0x143aad;
      piVar24 = a_00;
      iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,psVar11,1);
      if (iVar2 < 0) {
        return;
      }
      goto LAB_00143b4e;
    }
    psVar22 = (secp256k1_modinv64_signed62 *)(lVar39 * lStack_1c0);
    lVar16 = SUB168(SEXT816(lVar39) * SEXT816(lStack_1c0),8);
    uVar7 = (ulong)(-(long)psVar22 - 1U < uVar29);
    lVar15 = (0x7fffffffffffffff - lVar16) - (long)piVar24;
    a_01 = (int64_t *)0x8000000000000000;
    piVar20 = (int64_t *)
              ((-0x8000000000000000 - lVar16) -
              (ulong)(psVar22 != (secp256k1_modinv64_signed62 *)0x0));
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar16,(long)piVar24) != SBORROW8(lVar15,uVar7)) ==
             (long)(lVar15 - uVar7) < 0;
    if (lVar16 < 0) {
      bVar41 = (SBORROW8((long)piVar24,(long)piVar20) !=
               SBORROW8((long)piVar24 - (long)piVar20,(ulong)(uVar29 < (ulong)-(long)psVar22))) ==
               (long)(((long)piVar24 - (long)piVar20) - (ulong)(uVar29 < (ulong)-(long)psVar22)) < 0
      ;
    }
    piVar33 = piStack_1b0;
    if (!bVar41) goto LAB_00143b67;
    uVar8 = lVar39 * (long)psVar21;
    lVar31 = SUB168(SEXT816(lVar39) * SEXT816((long)psVar21),8);
    uVar7 = (ulong)(-uVar8 - 1 < uVar6);
    lVar39 = (0x7fffffffffffffff - lVar31) - lVar13;
    lVar37 = (-0x8000000000000000 - lVar31) - (ulong)(uVar8 != 0);
    lVar15 = lVar13 - lVar37;
    piVar33 = (int64_t *)(lVar15 - (ulong)(uVar6 < -uVar8));
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar31,lVar13) != SBORROW8(lVar39,uVar7)) ==
             (long)(lVar39 - uVar7) < 0;
    if (lVar31 < 0) {
      bVar41 = (SBORROW8(lVar13,lVar37) != SBORROW8(lVar15,(ulong)(uVar6 < -uVar8))) ==
               (long)piVar33 < 0;
    }
    uVar14 = (uint)bVar41;
    if (bVar41 != false) {
      bVar41 = CARRY8(uVar29,(ulong)psVar22);
      uVar29 = (long)psVar22->v + uVar29;
      piVar24 = (int64_t *)((long)piVar24 + (ulong)bVar41 + lVar16);
      bVar41 = CARRY8(uVar6,uVar8);
      uVar6 = uVar6 + uVar8;
      lVar13 = lVar13 + lVar31 + (ulong)bVar41;
      goto LAB_00143804;
    }
  }
  piStack_1f0 = (int64_t *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_18();
  psVar12 = &sStack_250;
  psStack_200 = psVar22;
  piStack_1f8 = a_01;
  piStack_1f0 = piVar33;
  secp256k1_modinv64_mul_62(&sStack_228,(secp256k1_modinv64_signed62 *)piVar24,uVar14,1);
  psVar11 = a;
  secp256k1_modinv64_mul_62(&sStack_250,a,5,(int64_t)psVar21);
  lVar39 = 0;
  while ((ulong)sStack_228.v[lVar39] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_250.v[lVar39]) goto LAB_00143c01;
    lVar39 = lVar39 + 1;
    if (lVar39 == 4) {
      uVar14 = 4;
      while( true ) {
        if (sStack_228.v[uVar14] < sStack_250.v[uVar14]) {
          return;
        }
        if (sStack_250.v[uVar14] < sStack_228.v[uVar14]) break;
        bVar41 = uVar14 == 0;
        uVar14 = uVar14 - 1;
        if (bVar41) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00143c01:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar2 = (int)psVar12;
  if (iVar2 < 1) {
LAB_00143ec0:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00143ec5:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00143eca:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00143ecf:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_00143ed4:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00143ed9:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar39 = psVar21->v[0];
    lVar13 = psVar21->v[1];
    lVar15 = psVar11->v[0];
    lVar16 = *extraout_RDX_00;
    uVar6 = lVar15 * lVar39;
    lVar37 = SUB168(SEXT816(lVar15) * SEXT816(lVar39),8);
    uVar7 = lVar16 * lVar13;
    lVar17 = SUB168(SEXT816(lVar16) * SEXT816(lVar13),8);
    lVar31 = (0x7fffffffffffffff - lVar17) - lVar37;
    if (-1 < lVar17 &&
        (SBORROW8(0x7fffffffffffffff - lVar17,lVar37) != SBORROW8(lVar31,(ulong)(~uVar7 < uVar6)))
        != (long)(lVar31 - (ulong)(~uVar7 < uVar6)) < 0) goto LAB_00143ec5;
    lVar31 = psVar21->v[2];
    lVar28 = lVar17 + lVar37 + (ulong)CARRY8(uVar7,uVar6);
    lVar37 = psVar21->v[3];
    uVar26 = lVar15 * lVar31;
    lVar17 = SUB168(SEXT816(lVar15) * SEXT816(lVar31),8);
    uVar29 = lVar16 * lVar37;
    lVar16 = SUB168(SEXT816(lVar16) * SEXT816(lVar37),8);
    uVar8 = (ulong)(-uVar29 - 1 < uVar26);
    lVar15 = (0x7fffffffffffffff - lVar16) - lVar17;
    if (-1 < lVar16 &&
        (SBORROW8(0x7fffffffffffffff - lVar16,lVar17) != SBORROW8(lVar15,uVar8)) !=
        (long)(lVar15 - uVar8) < 0) goto LAB_00143eca;
    lVar15 = lVar16 + lVar17 + (ulong)CARRY8(uVar29,uVar26);
    if ((uVar7 + uVar6 & 0x3fffffffffffffff) != 0) goto LAB_00143ecf;
    if ((uVar29 + uVar26 & 0x3fffffffffffffff) != 0) goto LAB_00143ed4;
    uVar8 = uVar29 + uVar26 >> 0x3e | lVar15 * 4;
    uVar6 = uVar7 + uVar6 >> 0x3e | lVar28 * 4;
    lVar15 = lVar15 >> 0x3e;
    lVar28 = lVar28 >> 0x3e;
    if (iVar2 != 1) {
      psVar21 = (secp256k1_modinv64_signed62 *)((ulong)psVar12 & 0xffffffff);
      psVar12 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar16 = psVar11->v[(long)psVar12];
        uVar26 = lVar16 * lVar39 + uVar6;
        lVar23 = SUB168(SEXT816(lVar16) * SEXT816(lVar39),8) + lVar28 +
                 (ulong)CARRY8(lVar16 * lVar39,uVar6);
        lVar17 = extraout_RDX_00[(long)psVar12];
        uVar7 = lVar17 * lVar13;
        lVar18 = SUB168(SEXT816(lVar17) * SEXT816(lVar13),8);
        uVar6 = (ulong)(-uVar7 - 1 < uVar26);
        lVar28 = (0x7fffffffffffffff - lVar18) - lVar23;
        psVar22 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar34 = (-0x8000000000000000 - lVar18) - (ulong)(uVar7 != 0);
        lVar35 = lVar23 - lVar34;
        bVar41 = (SBORROW8(0x7fffffffffffffff - lVar18,lVar23) != SBORROW8(lVar28,uVar6)) ==
                 (long)(lVar28 - uVar6) < 0;
        if (lVar18 < 0) {
          bVar41 = (SBORROW8(lVar23,lVar34) != SBORROW8(lVar35,(ulong)(uVar26 < -uVar7))) ==
                   (long)(lVar35 - (ulong)(uVar26 < -uVar7)) < 0;
        }
        if (!bVar41) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00143ebb:
          psVar11 = psVar22;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_00143ec0;
        }
        uVar27 = lVar16 * lVar31 + uVar8;
        lVar35 = SUB168(SEXT816(lVar16) * SEXT816(lVar31),8) + lVar15 +
                 (ulong)CARRY8(lVar16 * lVar31,uVar8);
        uVar29 = lVar17 * lVar37;
        lVar17 = SUB168(SEXT816(lVar17) * SEXT816(lVar37),8);
        uVar6 = (ulong)(-uVar29 - 1 < uVar27);
        lVar15 = (0x7fffffffffffffff - lVar17) - lVar35;
        lVar28 = (-0x8000000000000000 - lVar17) - (ulong)(uVar29 != 0);
        lVar16 = lVar35 - lVar28;
        bVar41 = (SBORROW8(0x7fffffffffffffff - lVar17,lVar35) != SBORROW8(lVar15,uVar6)) ==
                 (long)(lVar15 - uVar6) < 0;
        if (lVar17 < 0) {
          bVar41 = (SBORROW8(lVar35,lVar28) != SBORROW8(lVar16,(ulong)(uVar27 < -uVar29))) ==
                   (long)(lVar16 - (ulong)(uVar27 < -uVar29)) < 0;
        }
        if (!bVar41) goto LAB_00143ebb;
        lVar28 = lVar18 + lVar23 + (ulong)CARRY8(uVar7,uVar26);
        lVar15 = lVar17 + lVar35 + (ulong)CARRY8(uVar29,uVar27);
        uVar6 = lVar28 * 4 | uVar7 + uVar26 >> 0x3e;
        psVar11->v[(long)((long)psVar12[-1].v + 0x27)] = uVar7 + uVar26 & 0x3fffffffffffffff;
        uVar8 = lVar15 * 4 | uVar29 + uVar27 >> 0x3e;
        extraout_RDX_00[(long)((long)psVar12[-1].v + 0x27)] = uVar29 + uVar27 & 0x3fffffffffffffff;
        psVar12 = (secp256k1_modinv64_signed62 *)((long)psVar12->v + 1);
        lVar15 = lVar15 >> 0x3e;
        lVar28 = lVar28 >> 0x3e;
      } while (psVar21 != psVar12);
    }
    if (lVar28 + -1 + (ulong)(0x7fffffffffffffff < uVar6) != -1) goto LAB_00143ed9;
    psVar11->v[(long)iVar2 + -1] = uVar6;
    if (lVar15 + -1 + (ulong)(0x7fffffffffffffff < uVar8) == -1) {
      extraout_RDX_00[(long)iVar2 + -1] = uVar8;
      return;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar39 = psVar12->v[0];
  lVar13 = psVar12->v[1];
  lVar15 = psVar12->v[2];
  lVar16 = psVar12->v[3];
  lVar31 = psVar12->v[4];
  lVar37 = 0;
  do {
    if (psVar12->v[lVar37] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014410f:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00144114;
    }
    if (0x3fffffffffffffff < psVar12->v[lVar37]) goto LAB_0014410f;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 5);
  iVar2 = secp256k1_modinv64_mul_cmp_62(psVar12,5,b,-2);
  if (iVar2 < 1) {
LAB_00144114:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00144119:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014411e:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar2 = secp256k1_modinv64_mul_cmp_62(psVar12,5,b,1);
    if (-1 < iVar2) goto LAB_00144119;
    uVar6 = lVar31 >> 0x3f;
    uVar26 = (long)psVar11 >> 0x3f;
    uVar7 = ((uVar6 & b->v[0]) + lVar39 ^ uVar26) - uVar26;
    uVar29 = ((long)uVar7 >> 0x3e) + (((uVar6 & b->v[1]) + lVar13 ^ uVar26) - uVar26);
    uVar27 = ((long)uVar29 >> 0x3e) + ((lVar15 + (uVar6 & b->v[2]) ^ uVar26) - uVar26);
    uVar8 = ((long)uVar27 >> 0x3e) + (((uVar6 & b->v[3]) + lVar16 ^ uVar26) - uVar26);
    lVar39 = ((long)uVar8 >> 0x3e) + (((uVar6 & b->v[4]) + lVar31 ^ uVar26) - uVar26);
    uVar26 = lVar39 >> 0x3f;
    uVar6 = (b->v[0] & uVar26) + (uVar7 & 0x3fffffffffffffff);
    uVar29 = ((long)uVar6 >> 0x3e) + (b->v[1] & uVar26) + (uVar29 & 0x3fffffffffffffff);
    uVar7 = ((long)uVar29 >> 0x3e) + (b->v[2] & uVar26) + (uVar27 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar7 >> 0x3e) + (b->v[3] & uVar26) + (uVar8 & 0x3fffffffffffffff);
    uVar26 = (b->v[4] & uVar26) + lVar39 + ((long)uVar8 >> 0x3e);
    psVar12->v[0] = uVar6 & 0x3fffffffffffffff;
    psVar12->v[1] = uVar29 & 0x3fffffffffffffff;
    psVar12->v[2] = uVar7 & 0x3fffffffffffffff;
    psVar12->v[3] = uVar8 & 0x3fffffffffffffff;
    psVar12->v[4] = uVar26;
    if (0x3fffffffffffffff < uVar26) goto LAB_0014411e;
    iVar2 = secp256k1_modinv64_mul_cmp_62(psVar12,5,b,0);
    if (-1 < iVar2) {
      iVar2 = secp256k1_modinv64_mul_cmp_62(psVar12,5,b,1);
      if (iVar2 < 0) {
        return;
      }
      goto LAB_00144128;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00144128:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;

    /* Do iterations of 62 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 62 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_divsteps_62_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of g is zero, there is a chance that g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn ^ (fn >> 63);
        cond |= gn ^ (gn >> 63);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint64_t)fn << 62;
            g.v[len - 2] |= (uint64_t)gn << 62;
            --len;
        }

        VERIFY_CHECK(++i < 12); /* We should never need more than 12*62 = 744 divsteps */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[len - 1], modinfo);
    *x = d;
}